

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.hpp
# Opt level: O2

void __thiscall ot::commissioner::CommissionerImpl::~CommissionerImpl(CommissionerImpl *this)

{
  (this->super_Commissioner)._vptr_Commissioner = (_func_int **)&PTR__CommissionerImpl_0028bed0;
  NetDiagData::~NetDiagData(&this->mDiagAnsTlvs);
  coap::Resource::~Resource(&this->mResourceDiagAns);
  coap::Resource::~Resource(&this->mResourceEnergyReport);
  coap::Resource::~Resource(&this->mResourcePanIdConflict);
  coap::Resource::~Resource(&this->mResourceDatasetChanged);
  TokenManager::~TokenManager(&this->mTokenManager);
  ProxyClient::~ProxyClient(&this->mProxyClient);
  coap::Resource::~Resource(&this->mResourceRlyRx);
  coap::Resource::~Resource(&this->mResourceUdpRx);
  Timer::~Timer(&this->mJoinerSessionTimer);
  std::
  _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession>,_std::_Select1st<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::JoinerSession>_>_>
  ::~_Rb_tree(&(this->mJoinerSessions)._M_t);
  coap::CoapSecure::~CoapSecure(&this->mBrClient);
  Timer::~Timer(&this->mKeepAliveTimer);
  Config::~Config(&this->mConfig);
  return;
}

Assistant:

~CommissionerImpl() override = default;